

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O2

void __thiscall
Eigen::internal::
binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
::binary_evaluator(binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                   *this,XprType *xpr)

{
  product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       *)&this->m_lhsImpl,&xpr->m_lhs);
  unary_evaluator<Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>,_Eigen::internal::IndexBased,_double>
  ::unary_evaluator((unary_evaluator<Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>,_Eigen::internal::IndexBased,_double>
                     *)&this->m_rhsImpl,&xpr->m_rhs);
  return;
}

Assistant:

binary_evaluator(const XprType& xpr)
    : m_functor(xpr.functor()),
      m_lhsImpl(xpr.lhs()), 
      m_rhsImpl(xpr.rhs())  
  {
    EIGEN_INTERNAL_CHECK_COST_VALUE(functor_traits<BinaryOp>::Cost);
    EIGEN_INTERNAL_CHECK_COST_VALUE(CoeffReadCost);
  }